

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sift_test.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  uint __line;
  long lVar1;
  long lVar2;
  char *__assertion;
  uint32_t i;
  ulong uVar3;
  ulong __n;
  int K;
  int dim;
  uint32_t num_bases;
  long local_168;
  float *local_160;
  int *gt_data;
  float *query_data;
  float *base_data;
  uint32_t num_gts;
  uint32_t num_queries;
  vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
  result;
  _Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
  local_120;
  L2Distance distance;
  HNSWIndex hnsw_index;
  
  if (argc < 4) {
    __assertion = 
    "argc >= 4 && \"Usage: sift_test dataset_path query_path groundtruth_path index_path\"";
    __line = 0x1c;
  }
  else {
    read_fvecs(argv[1],&base_data,&num_bases,&dim);
    read_fvecs(argv[2],&query_data,&num_queries,&dim);
    read_ivecs(argv[3],&gt_data,&num_gts,&K);
    __n = (ulong)num_gts;
    if (num_gts == num_queries) {
      distance.super_Distance.dim_ = (size_t)dim;
      distance.super_Distance.num = 0;
      distance.super_Distance._vptr_Distance = (_func_int **)&PTR_operator___0010dd28;
      hnsw::HNSWIndex::HNSWIndex
                (&hnsw_index,base_data,num_bases,dim,&distance.super_Distance,0x20,0x28);
      if (argc == 5) {
        hnsw::HNSWIndex::LoadIndex(&hnsw_index,argv[4]);
      }
      else {
        lVar2 = std::chrono::_V2::steady_clock::now();
        hnsw::HNSWIndex::Build(&hnsw_index);
        lVar1 = std::chrono::_V2::steady_clock::now();
        printf("HNSW Build time: %ldms\n",(lVar1 - lVar2) / 1000000,(lVar1 - lVar2) % 1000000);
        printf("Top layer: %d\n",(ulong)(uint)hnsw_index.top_layer_);
        printf("Distance calculations: %ld\n",distance.super_Distance.num);
        hnsw::HNSWIndex::SaveIndex(&hnsw_index,"index.bin");
      }
      local_160 = base_data;
      puts("Searching ...");
      hnsw_index.ef_search_ = 0x100;
      std::
      vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
      ::vector(&result,__n,(allocator_type *)&local_120);
      local_168 = std::chrono::_V2::steady_clock::now();
      lVar2 = 0;
      for (uVar3 = 0; __n != uVar3; uVar3 = uVar3 + 1) {
        hnsw::HNSWIndex::Search
                  ((PointSet *)&local_120,&hnsw_index,K,query_data + (uint)(dim * (int)uVar3));
        std::
        vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>::
        _M_move_assign((vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                        *)((long)&((result.
                                    super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->
                                  super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + lVar2),&local_120);
        std::
        _Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
        ::~_Vector_base(&local_120);
        lVar2 = lVar2 + 0x18;
      }
      lVar2 = std::chrono::_V2::steady_clock::now();
      lVar2 = (lVar2 - local_168) / 1000;
      printf(anon_var_dwarf_bab8,lVar2 / (long)__n,lVar2 % (long)__n);
      puts("Evaluating ...");
      ComputeRecall(num_gts,K,gt_data,&result);
      printf("Recall@100: %f\n");
      operator_delete(gt_data);
      operator_delete(local_160);
      operator_delete(query_data);
      std::
      vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
      ::~vector(&result);
      hnsw::HNSWIndex::~HNSWIndex(&hnsw_index);
      return 0;
    }
    __assertion = "num_gts == num_queries && \"#GT must be equal to #queries\"";
    __line = 0x20;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/KinglittleQ[P]hnsw/tests/sift_test.cpp"
                ,__line,"int main(int, char **)");
}

Assistant:

int main(int argc, char **argv) {
  float *base_data, *query_data;
  int *gt_data;
  uint32_t num_bases, num_queries, num_gts;
  int dim, K;

  assert(argc >= 4 && "Usage: sift_test dataset_path query_path groundtruth_path index_path");
  read_fvecs(argv[1], base_data, num_bases, dim);
  read_fvecs(argv[2], query_data, num_queries, dim);
  read_ivecs(argv[3], gt_data, num_gts, K);
  assert(num_gts == num_queries && "#GT must be equal to #queries");

  const uint32_t M = 32;
  const uint32_t ef_search = 256;
  const uint32_t ef_construction = 40;

  hnsw::L2Distance distance(dim);
  hnsw::HNSWIndex hnsw_index(base_data, num_bases, dim, distance, M, ef_construction);

  if (argc == 5) {
    hnsw_index.LoadIndex(argv[4]);
  } else {
    // Test build
    auto t0 = steady_clock::now();
    hnsw_index.Build();
    auto t1 = steady_clock::now();
    auto duration = duration_cast<milliseconds>(t1 - t0).count();
    printf("HNSW Build time: %ldms\n", duration);
    printf("Top layer: %d\n", hnsw_index.TopLayer());
    printf("Distance calculations: %ld\n", distance.num);

    hnsw_index.SaveIndex("index.bin");
  }

  printf("Searching ...\n");
  hnsw_index.SetEfSearch(ef_search);
  std::vector<PointSet> result(num_queries);
  auto t0 = steady_clock::now();
  for (uint32_t i = 0; i < num_queries; i++) {
    result[i] = hnsw_index.Search(K, &query_data[i * dim]);
  }
  auto t1 = steady_clock::now();
  auto duration = duration_cast<microseconds>(t1 - t0).count();
  printf("HNSW search speed: %ld µs/query\n", duration / num_queries);

  printf("Evaluating ...\n");
  double recall = ComputeRecall(num_queries, K, gt_data, result);
  printf("Recall@100: %f\n", recall);

  delete gt_data;
  delete base_data;
  delete query_data;

  return 0;
}